

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

size_t find_histogram_index(double energy)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar2 = 1000;
  do {
    uVar3 = uVar1 + uVar2 >> 1;
    if (histogram_energy_boundaries[uVar3] <= energy) {
      uVar1 = uVar3;
      uVar3 = uVar2;
    }
    uVar2 = uVar3;
  } while (uVar3 - uVar1 != 1);
  return uVar1;
}

Assistant:

static size_t find_histogram_index(double energy) {
  size_t index_min = 0;
  size_t index_max = 1000;
  size_t index_mid;

  do {
    index_mid = (index_min + index_max) / 2;
    if (energy >= histogram_energy_boundaries[index_mid]) {
      index_min = index_mid;
    } else {
      index_max = index_mid;
    }
  } while (index_max - index_min != 1);

  return index_min;
}